

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_bid(archive_read *a,wchar_t best_bid)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *p;
  void *in_RDI;
  archive_entry_header_ustar *header;
  char *h;
  wchar_t bid;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar4;
  
  p = (char *)__archive_read_ahead
                        ((archive_read *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,(ssize_t *)0x14d9f8);
  if (p == (char *)0x0) {
    wVar4 = L'\xffffffff';
  }
  else if ((*p == '\0') && (wVar4 = archive_block_is_null(p), wVar4 != L'\0')) {
    wVar4 = L'\n';
  }
  else {
    wVar4 = checksum((archive_read *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDI);
    if (wVar4 == L'\0') {
      wVar4 = L'\0';
    }
    else {
      local_18 = 0x30;
      iVar1 = memcmp(p + 0x101,"ustar",6);
      iVar2 = 0x30;
      if ((iVar1 == 0) && (iVar2 = local_18, *(short *)(p + 0x107) == 0x3030)) {
        iVar2 = 0x68;
      }
      local_18 = iVar2;
      iVar2 = memcmp(p + 0x101,"ustar ",6);
      if ((iVar2 == 0) && (*(short *)(p + 0x107) == 0x20)) {
        local_18 = local_18 + 0x38;
      }
      if ((((p[0x9c] == '\0') || (('/' < p[0x9c] && (p[0x9c] < ':')))) ||
          (('@' < p[0x9c] && (p[0x9c] < '[')))) || (('`' < p[0x9c] && (p[0x9c] < '{')))) {
        wVar4 = local_18 + L'\x02';
        uVar3 = (uint)(byte)p[100];
        if ((((uVar3 != 0) && (uVar3 != 0x20)) && (7 < uVar3 - 0x30)) && (uVar3 != 0xff)) {
          wVar4 = L'\0';
        }
      }
      else {
        wVar4 = L'\0';
      }
    }
  }
  return wVar4;
}

Assistant:

static int
archive_read_format_tar_bid(struct archive_read *a, int best_bid)
{
	int bid;
	const char *h;
	const struct archive_entry_header_ustar *header;

	(void)best_bid; /* UNUSED */

	bid = 0;

	/* Now let's look at the actual header and see if it matches. */
	h = __archive_read_ahead(a, 512, NULL);
	if (h == NULL)
		return (-1);

	/* If it's an end-of-archive mark, we can handle it. */
	if (h[0] == 0 && archive_block_is_null(h)) {
		/*
		 * Usually, I bid the number of bits verified, but
		 * in this case, 4096 seems excessive so I picked 10 as
		 * an arbitrary but reasonable-seeming value.
		 */
		return (10);
	}

	/* If it's not an end-of-archive mark, it must have a valid checksum.*/
	if (!checksum(a, h))
		return (0);
	bid += 48;  /* Checksum is usually 6 octal digits. */

	header = (const struct archive_entry_header_ustar *)h;

	/* Recognize POSIX formats. */
	if ((memcmp(header->magic, "ustar\0", 6) == 0)
	    && (memcmp(header->version, "00", 2) == 0))
		bid += 56;

	/* Recognize GNU tar format. */
	if ((memcmp(header->magic, "ustar ", 6) == 0)
	    && (memcmp(header->version, " \0", 2) == 0))
		bid += 56;

	/* Type flag must be null, digit or A-Z, a-z. */
	if (header->typeflag[0] != 0 &&
	    !( header->typeflag[0] >= '0' && header->typeflag[0] <= '9') &&
	    !( header->typeflag[0] >= 'A' && header->typeflag[0] <= 'Z') &&
	    !( header->typeflag[0] >= 'a' && header->typeflag[0] <= 'z') )
		return (0);
	bid += 2;  /* 6 bits of variation in an 8-bit field leaves 2 bits. */

	/* Sanity check: Look at first byte of mode field. */
	switch (255 & (unsigned)header->mode[0]) {
	case 0: case 255:
		/* Base-256 value: No further verification possible! */
		break;
	case ' ': /* Not recommended, but not illegal, either. */
		break;
	case '0': case '1': case '2': case '3':
	case '4': case '5': case '6': case '7':
		/* Octal Value. */
		/* TODO: Check format of remainder of this field. */
		break;
	default:
		/* Not a valid mode; bail out here. */
		return (0);
	}
	/* TODO: Sanity test uid/gid/size/mtime/rdevmajor/rdevminor fields. */

	return (bid);
}